

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O1

RK_U32 __thiscall
MppBufferService::get_misc(MppBufferService *this,MppBufferMode mode,MppBufferType type)

{
  RK_U32 RVar1;
  MppBufferType MVar2;
  
  MVar2 = type & 0xffff;
  if (MVar2 == MPP_BUFFER_TYPE_NORMAL) {
    RVar1 = 0;
  }
  else {
    if (1 < (int)mode) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "mode < MPP_BUFFER_MODE_BUTT","get_misc",0x458);
      if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0015babe;
    }
    if (MPP_BUFFER_TYPE_DMA_HEAP < MVar2) {
      _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "type < MPP_BUFFER_TYPE_BUTT","get_misc",0x459);
      if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_0015babe:
        abort();
      }
    }
    RVar1 = this->misc[mode][MVar2];
  }
  return RVar1;
}

Assistant:

RK_U32 MppBufferService::get_misc(MppBufferMode mode, MppBufferType type)
{
    type = (MppBufferType)(type & MPP_BUFFER_TYPE_MASK);
    if (type == MPP_BUFFER_TYPE_NORMAL)
        return 0;

    mpp_assert(mode < MPP_BUFFER_MODE_BUTT);
    mpp_assert(type < MPP_BUFFER_TYPE_BUTT);

    return misc[mode][type];
}